

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commands.cpp
# Opt level: O1

void * CommandsThread(void *pParam)

{
  FILE *__stream;
  char *pcVar1;
  char line [256];
  timespec local_148;
  char local_138;
  char local_137;
  
  puts("Type a command (e.g. help) or exit to terminate the program.");
  do {
    memset(&local_138,0,0x100);
    __stream = _stdin;
    do {
      while ((pcVar1 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%'))) {
        if ((local_138 != '/') || ((pcVar1 == (char *)0x0 || (local_137 != '/'))))
        goto LAB_0012c1f0;
      }
    } while (pcVar1 != (char *)0x0);
LAB_0012c1f0:
    if (pcVar1 == (char *)0x0 || local_138 == '$') {
      if (bExit != 0) {
        return (void *)0x0;
      }
      puts("Invalid command or stdin failure.");
      local_148.tv_sec = 0;
      local_148.tv_nsec = 100000000;
      nanosleep(&local_148,(timespec *)0x0);
    }
    else {
      if (bExit != 0) {
        return (void *)0x0;
      }
      Commands(&local_138);
    }
    if (bExit != 0) {
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE CommandsThread(void* pParam)
{
	char line[MAX_BUF_LEN];

	UNREFERENCED_PARAMETER(pParam);

	printf("Type a command (e.g. help) or exit to terminate the program.\n");

	// Read and execute commands from stdin.
	for (;;)
	{
		// fgets() should be a blocking call.
		// How to cancel it properly?

		memset(line, 0, sizeof(line));
		if (fgets3(stdin, line, sizeof(line)) != NULL)
		{
			if (bExit) break;
			Commands(line);
		}
		else
		{
			if (bExit) break;
			printf("Invalid command or stdin failure.\n");
			mSleep(100);
		}

		if (bExit) break;
	}

	return 0;
}